

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O0

void __thiscall UniValue::setInt(UniValue *this,int64_t val_)

{
  long in_RSI;
  long in_FS_OFFSET;
  ostringstream oss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  string *in_stack_fffffffffffffe60;
  UniValue *in_stack_fffffffffffffe68;
  ostringstream local_180 [376];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream(local_180);
  std::ostream::operator<<(local_180,in_RSI);
  std::__cxx11::ostringstream::str();
  setNumStr(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  std::__cxx11::string::~string(in_stack_fffffffffffffe28);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UniValue::setInt(int64_t val_)
{
    std::ostringstream oss;

    oss << val_;

    return setNumStr(oss.str());
}